

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Entry * __thiscall
QHash<int,_ProFileCache::Entry>::operator[](QHash<int,_ProFileCache::Entry> *this,int *key)

{
  Entry *pEVar1;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffb8;
  QHash<int,_ProFileCache::Entry> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pEVar1 = iterator::operator*((iterator *)0x30e9a3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pEVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }